

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqliteBitvecSet(Bitvec *p,pgno i)

{
  sxu32 sVar1;
  sxu32 sVar2;
  bitvec_rec *pbVar3;
  bitvec_rec *pSrc;
  uint uVar4;
  bitvec_rec **ppbVar5;
  bool bVar6;
  
  pbVar3 = (bitvec_rec *)SyMemBackendPoolAlloc(p->pAlloc,0x18);
  if (pbVar3 != (bitvec_rec *)0x0) {
    SyZero(pbVar3,0x18);
    pbVar3->iPage = i;
    sVar1 = p->nSize;
    uVar4 = (uint)i & sVar1 - 1;
    ppbVar5 = p->apRec;
    pbVar3->pNextCol = ppbVar5[(int)uVar4];
    ppbVar5[(int)uVar4] = pbVar3;
    pbVar3->pNext = p->pList;
    p->pList = pbVar3;
    uVar4 = p->nRec + 1;
    p->nRec = uVar4;
    bVar6 = uVar4 < sVar1 * 3;
    pbVar3 = (bitvec_rec *)(ulong)CONCAT31((int3)(uVar4 >> 8),99999 < uVar4 || bVar6);
    if (99999 >= uVar4 && !bVar6) {
      pSrc = (bitvec_rec *)SyMemBackendAlloc(p->pAlloc,sVar1 << 4);
      pbVar3 = pSrc;
      if (pSrc != (bitvec_rec *)0x0) {
        ppbVar5 = &p->pList;
        SyZero(pSrc,sVar1 << 4);
        sVar2 = p->nRec;
        while (bVar6 = sVar2 != 0, sVar2 = sVar2 - 1, bVar6) {
          pbVar3 = *ppbVar5;
          pbVar3->pNextCol = (bitvec_rec *)0x0;
          uVar4 = (uint)pbVar3->iPage & sVar1 * 2 - 1;
          pbVar3->pNextCol = (bitvec_rec *)(&pSrc->iPage)[uVar4];
          (&pSrc->iPage)[uVar4] = (pgno)pbVar3;
          ppbVar5 = &pbVar3->pNext;
        }
        uVar4 = SyMemBackendFree(p->pAlloc,p->apRec);
        pbVar3 = (bitvec_rec *)(ulong)uVar4;
        p->apRec = (bitvec_rec **)pSrc;
        p->nSize = sVar1 * 2;
      }
    }
  }
  return (int)pbVar3;
}

Assistant:

UNQLITE_PRIVATE int unqliteBitvecSet(Bitvec *p,pgno i)
{
	bitvec_rec *pRec;
	sxi32 iBuck;
	/* Allocate a new instance */
	pRec = (bitvec_rec *)SyMemBackendPoolAlloc(p->pAlloc,sizeof(bitvec_rec));
	if( pRec == 0 ){
		return UNQLITE_NOMEM;
	}
	/* Zero the structure */
	SyZero(pRec,sizeof(bitvec_rec));
	/* Fill-in */
	pRec->iPage = i;
	iBuck = i & (p->nSize - 1);
	pRec->pNextCol = p->apRec[iBuck];
	p->apRec[iBuck] = pRec;
	pRec->pNext = p->pList;
	p->pList = pRec;
	p->nRec++;
	if( p->nRec >= (p->nSize * 3) && p->nRec < 100000 ){
		/* Grow the hashtable */
		sxu32 nNewSize = p->nSize << 1;
		bitvec_rec *pEntry,**apNew;
		sxu32 n;
		apNew = (bitvec_rec **)SyMemBackendAlloc(p->pAlloc, nNewSize * sizeof(bitvec_rec *));
		if( apNew ){
			sxu32 iBucket;
			/* Zero the new table */
			SyZero((void *)apNew, nNewSize * sizeof(bitvec_rec *));
			/* Rehash all entries */
			n = 0;
			pEntry = p->pList;
			for(;;){
				/* Loop one */
				if( n >= p->nRec ){
					break;
				}
				pEntry->pNextCol = 0;
				/* Install in the new bucket */
				iBucket = pEntry->iPage & (nNewSize - 1);
				pEntry->pNextCol = apNew[iBucket];
				apNew[iBucket] = pEntry;
				/* Point to the next entry */
				pEntry = pEntry->pNext;
				n++;
			}
			/* Release the old table and reflect the change */
			SyMemBackendFree(p->pAlloc,(void *)p->apRec);
			p->apRec = apNew;
			p->nSize  = nNewSize;
		}
	}
	return UNQLITE_OK;
}